

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O2

void __thiscall Centaurus::SimpleException::SimpleException(SimpleException *this,string *msg)

{
  *(undefined ***)this = &PTR__SimpleException_00197e60;
  std::__cxx11::string::string((string *)&this->m_msg,(string *)msg);
  return;
}

Assistant:

SimpleException(const std::string& msg) noexcept
        : m_msg(msg)
    {
    }